

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

Offsets google::protobuf::internal::AlignAndAddSizeDynamic
                  (size_t v,TypeKind kind,MessageLite *value_prototype_if_message,size_t *max_align)

{
  byte bVar1;
  uint32_t uVar2;
  ClassData *this;
  ClassData *class_data;
  size_t *max_align_local;
  MessageLite *value_prototype_if_message_local;
  TypeKind kind_local;
  size_t v_local;
  size_t local_10;
  
  switch(kind) {
  case kBool:
    _v_local = AlignAndAddSize<bool>(v,max_align);
    break;
  case kU32:
    _v_local = AlignAndAddSize<int>(v,max_align);
    break;
  case kU64:
    _v_local = AlignAndAddSize<long>(v,max_align);
    break;
  case kFloat:
    _v_local = AlignAndAddSize<float>(v,max_align);
    break;
  case kDouble:
    _v_local = AlignAndAddSize<double>(v,max_align);
    break;
  case kString:
    _v_local = AlignAndAddSize<std::__cxx11::string>(v,max_align);
    break;
  case kMessage:
    this = GetClassData(value_prototype_if_message);
    bVar1 = ClassData::alignment(this);
    v_local = AlignTo(v,(ulong)bVar1,max_align);
    uVar2 = ClassData::allocation_size(this);
    local_10 = v_local + uVar2;
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
                ,0xea);
  }
  return _v_local;
}

Assistant:

static Offsets AlignAndAddSizeDynamic(
    size_t v, UntypedMapBase::TypeKind kind,
    const MessageLite* value_prototype_if_message, size_t& max_align) {
  switch (kind) {
    case UntypedMapBase::TypeKind::kBool:
      return AlignAndAddSize<bool>(v, max_align);
    case UntypedMapBase::TypeKind::kU32:
      return AlignAndAddSize<int32_t>(v, max_align);
    case UntypedMapBase::TypeKind::kU64:
      return AlignAndAddSize<int64_t>(v, max_align);
    case UntypedMapBase::TypeKind::kFloat:
      return AlignAndAddSize<float>(v, max_align);
    case UntypedMapBase::TypeKind::kDouble:
      return AlignAndAddSize<double>(v, max_align);
    case UntypedMapBase::TypeKind::kString:
      return AlignAndAddSize<std::string>(v, max_align);
    case UntypedMapBase::TypeKind::kMessage: {
      auto* class_data = GetClassData(*value_prototype_if_message);
      v = AlignTo(v, class_data->alignment(), max_align);
      return {v, v + class_data->allocation_size()};
    }
    default:
      Unreachable();
  }
}